

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlZMemBuffExtend(xmlZMemBuffPtr buff,size_t ext_amt)

{
  uchar *puVar1;
  Bytef *pBVar2;
  uchar *puVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  xmlChar msg [500];
  xmlChar axStack_228 [512];
  
  iVar5 = -1;
  if (buff != (xmlZMemBuffPtr)0x0) {
    iVar5 = 0;
    if (ext_amt != 0) {
      puVar1 = buff->zbuff;
      pBVar2 = (buff->zctrl).next_out;
      sVar4 = ext_amt + buff->size;
      puVar3 = (uchar *)(*xmlRealloc)(puVar1,sVar4);
      if (puVar3 == (uchar *)0x0) {
        xmlStrPrintf(axStack_228,500,"xmlZMemBuffExtend:  %s %lu bytes.\n",
                     "Allocation failure extending output buffer to",sVar4);
        __xmlSimpleError(8,0x60a,(xmlNodePtr)0x0,"write error",(char *)axStack_228);
        iVar5 = -1;
      }
      else {
        lVar6 = (long)pBVar2 - (long)puVar1;
        buff->size = sVar4;
        buff->zbuff = puVar3;
        (buff->zctrl).next_out = puVar3 + lVar6;
        (buff->zctrl).avail_out = (int)sVar4 - (int)lVar6;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

static int
xmlZMemBuffExtend( xmlZMemBuffPtr buff, size_t ext_amt ) {

    int			rc = -1;
    size_t		new_size;
    size_t		cur_used;

    unsigned char *	tmp_ptr = NULL;

    if ( buff == NULL )
	return ( -1 );

    else if ( ext_amt == 0 )
	return ( 0 );

    cur_used = buff->zctrl.next_out - buff->zbuff;
    new_size = buff->size + ext_amt;

#ifdef DEBUG_HTTP
    if ( cur_used > new_size )
	xmlGenericError( xmlGenericErrorContext,
			"xmlZMemBuffExtend:  %s\n%s %d bytes.\n",
			"Buffer overwrite detected during compressed memory",
			"buffer extension.  Overflowed by",
			(cur_used - new_size ) );
#endif

    tmp_ptr = xmlRealloc( buff->zbuff, new_size );
    if ( tmp_ptr != NULL ) {
	rc = 0;
	buff->size  = new_size;
	buff->zbuff = tmp_ptr;
	buff->zctrl.next_out  = tmp_ptr + cur_used;
	buff->zctrl.avail_out = new_size - cur_used;
    }
    else {
	xmlChar msg[500];
	xmlStrPrintf(msg, 500,
		    "xmlZMemBuffExtend:  %s %lu bytes.\n",
		    "Allocation failure extending output buffer to",
		    (unsigned long) new_size );
	xmlIOErr(XML_IO_WRITE, (const char *) msg);
    }

    return ( rc );
}